

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onExitBuiltInFunctionInvocationExpressionAstNode
          (CompilerAstWalker *this,BuiltInFunctionInvocationExpressionAstNode *node)

{
  bool mustBeTrue;
  element_type *__x;
  pointer ppVar1;
  allocator<char> local_49;
  string local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_true>
  local_20;
  iterator find;
  BuiltInFunctionInvocationExpressionAstNode *node_local;
  CompilerAstWalker *this_local;
  
  find.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_true>
               )node;
  __x = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &node->identifier);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>_>_>
       ::find(&this->builtInFunctionLookup,&__x->value);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>_>_>
       ::end(&this->builtInFunctionLookup);
  mustBeTrue = std::__detail::operator!=(&local_20,&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "onExitBuiltInFunctionInvocationExpressionAstNode found a built in function it does not know about"
             ,&local_49);
  Error::assertWithPanic(mustBeTrue,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bytecode::ByteCodeInstruction>,_false,_true>
                         *)&local_20);
  emit(this,ppVar1->second);
  return;
}

Assistant:

void onExitBuiltInFunctionInvocationExpressionAstNode(BuiltInFunctionInvocationExpressionAstNode* node) noexcept override {
    auto find = this->builtInFunctionLookup.find(node->identifier->value);

    Error::assertWithPanic(
      find != this->builtInFunctionLookup.end(),
      "onExitBuiltInFunctionInvocationExpressionAstNode found a built in function it does not know about");

    this->emit(find->second);
  }